

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

void __thiscall CVmObjFrameRef::save_to_file(CVmObjFrameRef *this,CVmFile *fp)

{
  int iVar1;
  long *plVar2;
  uint16_t tmp;
  int iVar3;
  vm_val_t *val;
  char buf [5];
  char b_2 [4];
  undefined2 local_32 [3];
  undefined4 local_2c;
  
  plVar2 = (long *)(this->super_CVmObject).ext_;
  if (*plVar2 != 0) {
    make_snapshot(this);
  }
  local_32[0] = (undefined2)plVar2[4];
  CVmFile::write_bytes(fp,(char *)local_32,2);
  local_32[0] = *(undefined2 *)((long)plVar2 + 0x24);
  CVmFile::write_bytes(fp,(char *)local_32,2);
  vmb_put_dh((char *)local_32,(vm_val_t *)(plVar2 + 1));
  CVmFile::write_bytes(fp,(char *)local_32,5);
  vmb_put_dh((char *)local_32,(vm_val_t *)(plVar2 + 5));
  CVmFile::write_bytes(fp,(char *)local_32,5);
  local_2c = (undefined4)plVar2[7];
  CVmFile::write_bytes(fp,(char *)&local_2c,4);
  local_2c = *(undefined4 *)((long)plVar2 + 0x3c);
  CVmFile::write_bytes(fp,(char *)&local_2c,4);
  local_2c = CONCAT22(local_2c._2_2_,(short)plVar2[8]);
  CVmFile::write_bytes(fp,(char *)&local_2c,2);
  vmb_put_dh((char *)local_32,(vm_val_t *)(plVar2 + 9));
  CVmFile::write_bytes(fp,(char *)local_32,5);
  iVar3 = (int)plVar2[4];
  iVar1 = *(int *)((long)plVar2 + 0x24);
  if (iVar3 + iVar1 != 0 && SCARRY4(iVar3,iVar1) == iVar3 + iVar1 < 0) {
    val = (vm_val_t *)(plVar2 + 0xb);
    iVar3 = iVar1 + iVar3 + 1;
    do {
      vmb_put_dh((char *)local_32,val);
      CVmFile::write_bytes(fp,(char *)local_32,5);
      val = val + 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

void CVmObjFrameRef::save_to_file(VMG_ class CVmFile *fp)
{
    char buf[VMB_DATAHOLDER];
    
    /* get our extension */
    vm_frameref_ext *ext = get_ext();
    
    /* 
     *   If our frame is still active, make a snapshot of the variables.  The
     *   stack frame itself is inherently transient, so we can only save the
     *   snapshot version.  
     */
    if (ext->fp != 0)
        make_snapshot(vmg0_);

    /* save the variable counts */
    fp->write_uint2(ext->nlocals);
    fp->write_uint2(ext->nparams);

    /* save the entry pointer */
    vmb_put_dh(buf, &ext->entry);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* save the method context values */
    vmb_put_dh(buf, &ext->self);
    fp->write_bytes(buf, VMB_DATAHOLDER);
    fp->write_uint4(ext->defobj);
    fp->write_uint4(ext->targobj);
    fp->write_uint2(ext->targprop);
    vmb_put_dh(buf, &ext->invokee);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* save the variable snapshot values */
    int i;
    const vm_val_t *v;
    for (i = ext->nparams + ext->nlocals, v = ext->vars ; i > 0 ; --i, ++v)
    {
        vmb_put_dh(buf, v);
        fp->write_bytes(buf, VMB_DATAHOLDER);
    }
}